

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record_Query_R_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::Record_Query_R_PDU::Encode(Record_Query_R_PDU *this)

{
  KDataStream *in_RSI;
  
  Encode((Record_Query_R_PDU *)&this[-1].super_Simulation_Management_Header.m_ReceivingEntityID,
         in_RSI);
  return;
}

Assistant:

void Record_Query_R_PDU::Encode( KDataStream & stream ) const
{
    Simulation_Management_Header::Encode( stream );

    stream << m_ui32RqId
           << m_ui8ReqRelSrv
           << m_ui8Padding
           << m_ui16EvntTyp
           << m_ui32Time
           << m_ui32NumRecs;

    vector<KUINT32>::const_iterator citr = m_vui32RecID.begin();
    vector<KUINT32>::const_iterator citrEnd = m_vui32RecID.end();

    for( ; citr != citrEnd; ++citr )
    {
        stream << *citr;
    }
}